

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void Catch::defaultListTests
               (ostream *out,ColourImpl *streamColour,
               vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
               bool isFiltered,Verbosity verbosity)

{
  pointer pTVar1;
  TestCaseInfo *pTVar2;
  ostream *poVar3;
  undefined7 in_register_00000009;
  long lVar4;
  size_type sVar5;
  pointer pTVar6;
  char *pcVar7;
  Column *pCVar8;
  undefined8 uVar9;
  TestCaseHandle *test;
  char local_a9;
  enable_if_t<_::Catch::Detail::IsStreamInsertable<SourceLineInfo>::value,_std::string> local_a8;
  Column local_88;
  undefined4 local_44;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *local_40;
  pointer local_38;
  
  if (verbosity == Quiet) {
    pTVar6 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pTVar1 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar6 != pTVar1) {
      do {
        pTVar2 = pTVar6->m_info;
        pCVar8 = (Column *)(pTVar2->name)._M_dataplus._M_p;
        sVar5 = (pTVar2->name)._M_string_length;
        poVar3 = out;
        if ((sVar5 != 0) && (*(char *)&(pCVar8->m_string).m_string._M_dataplus == '#')) {
          local_88.m_string.m_string._M_dataplus._M_p._0_1_ = 0x22;
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_88,1);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(pTVar2->name)._M_dataplus._M_p,(pTVar2->name)._M_string_length
                             );
          local_88.m_string.m_string._M_dataplus._M_p._0_1_ = 0x22;
          sVar5 = 1;
          pCVar8 = &local_88;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)pCVar8,sVar5);
        local_88.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_88,1);
        pTVar6 = pTVar6 + 1;
      } while (pTVar6 != pTVar1);
    }
  }
  else {
    local_44 = (undefined4)CONCAT71(in_register_00000009,isFiltered);
    if (isFiltered) {
      pcVar7 = "Matching test cases:\n";
      lVar4 = 0x15;
    }
    else {
      pcVar7 = "All available test cases:\n";
      lVar4 = 0x1a;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,lVar4);
    pTVar6 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_38 = (tests->
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    local_40 = tests;
    if (pTVar6 != local_38) {
      do {
        pTVar2 = pTVar6->m_info;
        uVar9 = 0;
        if ((pTVar2->properties & IsHidden) != None) {
          uVar9 = 0x17;
        }
        (*streamColour->_vptr_ColourImpl[2])(streamColour,uVar9);
        TextFlow::Column::Column(&local_88,&pTVar2->name);
        local_88.m_indent = 2;
        TextFlow::operator<<(out,&local_88);
        local_a8._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_a8,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.m_string.m_string._M_dataplus._M_p != &local_88.m_string.m_string.field_2) {
          operator_delete(local_88.m_string.m_string._M_dataplus._M_p,
                          local_88.m_string.m_string.field_2._M_allocated_capacity + 1);
        }
        if (1 < (int)verbosity) {
          StringMaker<Catch::SourceLineInfo,_void>::convert<Catch::SourceLineInfo>
                    (&local_a8,&pTVar2->lineInfo);
          local_88.m_string.m_string._M_dataplus._M_p = (pointer)&local_88.m_string.m_string.field_2
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
            local_88.m_string.m_string.field_2._8_8_ = local_a8.field_2._8_8_;
          }
          else {
            local_88.m_string.m_string._M_dataplus._M_p = local_a8._M_dataplus._M_p;
          }
          local_88.m_string.m_string.field_2._M_allocated_capacity._1_7_ =
               local_a8.field_2._M_allocated_capacity._1_7_;
          local_88.m_string.m_string.field_2._M_local_buf[0] = local_a8.field_2._M_local_buf[0];
          local_88.m_string.m_string._M_string_length = local_a8._M_string_length;
          local_a8._M_string_length = 0;
          local_a8.field_2._M_local_buf[0] = '\0';
          local_88.m_string.m_size = 0;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          TextFlow::AnsiSkippingString::preprocessString(&local_88.m_string);
          local_88.m_width = 0x4f;
          local_88.m_initialIndent = 0xffffffffffffffff;
          local_88.m_indent = 4;
          TextFlow::operator<<(out,&local_88);
          local_a9 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_a9,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.m_string.m_string._M_dataplus._M_p != &local_88.m_string.m_string.field_2)
          {
            operator_delete(local_88.m_string.m_string._M_dataplus._M_p,
                            local_88.m_string.m_string.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((0 < (int)verbosity) &&
           ((pTVar2->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pTVar2->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
          TestCaseInfo::tagsAsString_abi_cxx11_(&local_a8,pTVar2);
          local_88.m_string.m_string._M_dataplus._M_p = (pointer)&local_88.m_string.m_string.field_2
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
            local_88.m_string.m_string.field_2._8_8_ = local_a8.field_2._8_8_;
          }
          else {
            local_88.m_string.m_string._M_dataplus._M_p = local_a8._M_dataplus._M_p;
          }
          local_88.m_string.m_string.field_2._M_allocated_capacity._1_7_ =
               local_a8.field_2._M_allocated_capacity._1_7_;
          local_88.m_string.m_string.field_2._M_local_buf[0] = local_a8.field_2._M_local_buf[0];
          local_88.m_string.m_string._M_string_length = local_a8._M_string_length;
          local_a8._M_string_length = 0;
          local_a8.field_2._M_local_buf[0] = '\0';
          local_88.m_string.m_size = 0;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          TextFlow::AnsiSkippingString::preprocessString(&local_88.m_string);
          local_88.m_width = 0x4f;
          local_88.m_initialIndent = 0xffffffffffffffff;
          local_88.m_indent = 6;
          TextFlow::operator<<(out,&local_88);
          local_a9 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_a9,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.m_string.m_string._M_dataplus._M_p != &local_88.m_string.m_string.field_2)
          {
            operator_delete(local_88.m_string.m_string._M_dataplus._M_p,
                            local_88.m_string.m_string.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
        }
        (*streamColour->_vptr_ColourImpl[2])(streamColour,0);
        pTVar6 = pTVar6 + 1;
      } while (pTVar6 != local_38);
    }
    if ((char)local_44 == '\0') {
      lVar4 = (long)(local_40->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_40->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_88.m_string.m_string._M_string_length = 0x180ba6;
      local_88.m_string.m_string.field_2._M_allocated_capacity = 9;
    }
    else {
      lVar4 = (long)(local_40->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_40->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_88.m_string.m_string._M_string_length = 0x180b9d;
      local_88.m_string.m_string.field_2._M_allocated_capacity = 0x12;
    }
    local_88.m_string.m_string._M_dataplus._M_p = (pointer)(lVar4 >> 4);
    operator<<(out,(pluralise *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n\n",2);
  }
  std::ostream::flush();
  return;
}

Assistant:

void defaultListTests(std::ostream& out, ColourImpl* streamColour, std::vector<TestCaseHandle> const& tests, bool isFiltered, Verbosity verbosity) {
        // We special case this to provide the equivalent of old
        // `--list-test-names-only`, which could then be used by the
        // `--input-file` option.
        if (verbosity == Verbosity::Quiet) {
            listTestNamesOnly(out, tests);
            return;
        }

        if (isFiltered) {
            out << "Matching test cases:\n";
        } else {
            out << "All available test cases:\n";
        }

        for (auto const& test : tests) {
            auto const& testCaseInfo = test.getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            auto colourGuard = streamColour->guardColour( colour ).engage( out );

            out << TextFlow::Column(testCaseInfo.name).indent(2) << '\n';
            if (verbosity >= Verbosity::High) {
                out << TextFlow::Column(Catch::Detail::stringify(testCaseInfo.lineInfo)).indent(4) << '\n';
            }
            if (!testCaseInfo.tags.empty() &&
                verbosity > Verbosity::Quiet) {
                out << TextFlow::Column(testCaseInfo.tagsAsString()).indent(6) << '\n';
            }
        }

        if (isFiltered) {
            out << pluralise(tests.size(), "matching test case"_sr);
        } else {
            out << pluralise(tests.size(), "test case"_sr);
        }
        out << "\n\n" << std::flush;
    }